

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O0

void __thiscall DetectorSS::Mergebmp(DetectorSS *this,uchar *bmp1,uchar *bmp2,int start,int len)

{
  int iVar1;
  uint uVar2;
  int pos;
  int index;
  int n;
  uchar temp;
  int curlen;
  int len_local;
  int start_local;
  uchar *bmp2_local;
  uchar *bmp1_local;
  DetectorSS *this_local;
  
  for (curlen = 0; curlen < len; curlen = (8 - uVar2) + curlen) {
    iVar1 = start + curlen >> 3;
    uVar2 = start + curlen & 7;
    bmp1[iVar1] = bmp1[iVar1] | bmp2[iVar1] & (byte)(0xff >> (sbyte)uVar2);
  }
  return;
}

Assistant:

void DetectorSS::Mergebmp(unsigned char* bmp1, unsigned char* bmp2,
	int start, int len) {
	int curlen = 0;
	while (curlen < len) {
		unsigned char temp = 0;
		int n = start + curlen;
		int index = n >> 3;
		int pos = n & 0x00000007;

		temp = bmp2[index] & (0xff >> pos);
		bmp1[index] |= temp;
		curlen += 8 - pos;
	}
}